

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

void opengv::printEssentialMatrix(translation_t *position,rotation_t *rotation)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  ostream *poVar3;
  double dVar4;
  size_t c_1;
  size_t r_1;
  size_t c;
  size_t r;
  double matrixNorm;
  essential_t E;
  Matrix3d t_skew;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_00000128;
  ostream *in_stack_00000130;
  EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_fffffffffffffed8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *in_stack_fffffffffffffee0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  double local_c8;
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffee0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffed8);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cedd2);
  *pSVar2 = -dVar4;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cee0e);
  *pSVar2 = dVar4;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cee4a);
  *pSVar2 = dVar4;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cee9d);
  *pSVar2 = -dVar4;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3ceef0);
  *pSVar2 = -dVar4;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cef2c);
  *pSVar2 = dVar4;
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffee0,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffed8);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_c8 = 0.0;
  for (local_d0 = 0; local_d0 < 3; local_d0 = local_d0 + 1) {
    for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cefa4);
      dVar4 = pow(*pSVar2,2.0);
      local_c8 = dVar4 + local_c8;
    }
  }
  dVar4 = sqrt(local_c8);
  for (local_e0 = 0; local_e0 < 3; local_e0 = local_e0 + 1) {
    for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cf02a);
      in_stack_fffffffffffffee0 =
           (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)(*pSVar2 / dVar4);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x3cf04e);
      *pSVar2 = (Scalar)in_stack_fffffffffffffee0;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"the random essential matrix is:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = Eigen::operator<<(in_stack_00000130,in_stack_00000128);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
opengv::printEssentialMatrix(
    const translation_t & position,
    const rotation_t & rotation)
{
  //E transforms vectors from vp 2 to 1: x_1^T * E * x_2 = 0
  //and E = (t)_skew*R
  Eigen::Matrix3d t_skew = Eigen::Matrix3d::Zero();
  t_skew(0,1) = -position[2];
  t_skew(0,2) = position[1];
  t_skew(1,0) = position[2];
  t_skew(1,2) = -position[0];
  t_skew(2,0) = -position[1];
  t_skew(2,1) = position[0];

  essential_t E = t_skew * rotation;
  double matrixNorm = 0.0;
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      matrixNorm += pow(E(r,c),2);
  }
  matrixNorm = sqrt(matrixNorm);
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      E(r,c) = E(r,c) / matrixNorm;
  }

  std::cout << "the random essential matrix is:" << std::endl;
  std::cout << E << std::endl;
}